

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinSqrt
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  allocator_type *in_RCX;
  double dVar1;
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  Value VVar2;
  allocator<char> local_55;
  Type local_54;
  _Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  local_50;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"sqrt",&local_55);
  local_54 = NUMBER;
  __l._M_len = 1;
  __l._M_array = &local_54;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
            *)&local_50,__l,in_RCX);
  validateBuiltinArgs(this,loc,&local_38,args,
                      (vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                       *)&local_50);
  std::
  _Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::~_Vector_base(&local_50);
  std::__cxx11::string::~string((string *)&local_38);
  dVar1 = (((args->
            super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
            )._M_impl.super__Vector_impl_data._M_start)->v).d;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  VVar2 = makeNumberCheck(this,loc,dVar1);
  (this->scratch).t = NUMBER;
  (this->scratch).v = VVar2._0_8_;
  return (AST *)0x0;
}

Assistant:

const AST *builtinSqrt(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "sqrt", args, {Value::NUMBER});
        scratch = makeNumberCheck(loc, std::sqrt(args[0].v.d));
        return nullptr;
    }